

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::fromLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  byte bVar1;
  uint uVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  VerySimpleReadOnlyString *needle;
  undefined8 extraout_RDX;
  VerySimpleReadOnlyString VVar3;
  int local_74;
  int local_70;
  int local_6c;
  uint local_5c;
  char *local_50;
  char *local_48;
  uint pos;
  bool includeFind_local;
  VerySimpleReadOnlyString *find_local;
  VerySimpleReadOnlyString *this_local;
  
  needle = (VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind);
  bVar1 = in_CL & 1;
  uVar2 = reverseFind(find,needle,0xffffffff);
  if (uVar2 == find->length) {
    if (bVar1 == 0) {
      local_48 = "";
    }
    else {
      local_48 = find->data;
    }
    local_50 = local_48;
  }
  else {
    local_5c = uVar2;
    if (bVar1 == 0) {
      local_5c = uVar2 + needle->length;
    }
    local_50 = find->data + local_5c;
  }
  if (uVar2 == find->length) {
    if (bVar1 == 0) {
      local_6c = 0;
    }
    else {
      local_6c = find->length;
    }
    local_70 = local_6c;
  }
  else {
    if (bVar1 == 0) {
      local_74 = (find->length - uVar2) - needle->length;
    }
    else {
      local_74 = find->length - uVar2;
    }
    local_70 = local_74;
  }
  VerySimpleReadOnlyString(this,local_50,local_70);
  VVar3._8_8_ = extraout_RDX;
  VVar3.data = (tCharPtr)this;
  return VVar3;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::fromLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length ? (includeFind ? data : "") : &data[includeFind ? pos : pos + (unsigned int)find.length],
	                                    pos == (unsigned int)length ? (includeFind ? (unsigned int)length : 0) : (includeFind ? (unsigned int)length - pos : (unsigned int)length - pos - (unsigned int)find.length));
	}